

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O1

size_t __thiscall cppurses::Text_display::index_at(Text_display *this,Point position)

{
  pointer pLVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = position.x;
  uVar3 = position.y + this->top_line_;
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->display_state_).
                    super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 4) <= uVar3) {
LAB_001487ec:
    return ((long)(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                  super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                  super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  if (pLVar1[uVar3].length <= uVar4) {
    if (pLVar1[uVar3].length != 0) {
      if (uVar3 != ((long)(this->display_state_).
                          super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 4) - 1U) {
        sVar2 = first_index_at(this,uVar3 + 1);
        return sVar2 - 1;
      }
      goto LAB_001487ec;
    }
    uVar4 = 0;
  }
  return uVar4 + pLVar1[uVar3].start_index;
}

Assistant:

std::size_t Text_display::index_at(Point position) const {
    auto line = this->top_line() + position.y;
    if (line >= display_state_.size()) {
        return this->contents().size();
    }
    auto info = display_state_.at(line);
    if (position.x >= info.length) {
        if (info.length == 0) {
            position.x = 0;
        } else if (this->top_line() + position.y != this->last_line()) {
            return this->first_index_at(this->top_line() + position.y + 1) - 1;
        } else if (this->top_line() + position.y == this->last_line()) {
            return this->contents().size();
        } else {
            position.x = info.length - 1;
        }
    }
    return info.start_index + position.x;
}